

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O1

int duckdb_brotli::BrotliDecoderAttachDictionary
              (BrotliDecoderStateInternal *state,BrotliSharedDictionaryType type,size_t data_size,
              uint8_t *data)

{
  uint uVar1;
  size_t sVar2;
  uint8_t *puVar3;
  int iVar4;
  BrotliSharedDictionaryInternal *pBVar5;
  BrotliDecoderCompoundDictionary *pBVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  
  iVar8 = 0;
  if (state->state == BROTLI_STATE_UNINITED) {
    uVar1 = state->dictionary->num_prefix;
    uVar9 = (ulong)uVar1;
    iVar4 = BrotliSharedDictionaryAttach(state->dictionary,type,data_size,data);
    iVar8 = 0;
    if (iVar4 != 0) {
      pBVar5 = state->dictionary;
      iVar8 = 1;
      if (uVar1 < pBVar5->num_prefix) {
        do {
          if (state->state != BROTLI_STATE_UNINITED) {
            return 0;
          }
          sVar2 = pBVar5->prefix_size[uVar9];
          puVar3 = pBVar5->prefix[uVar9];
          pBVar6 = state->compound_dictionary;
          if (pBVar6 == (BrotliDecoderCompoundDictionary *)0x0) {
            pBVar6 = (BrotliDecoderCompoundDictionary *)
                     (*state->alloc_func)(state->memory_manager_opaque,0x1e0);
            if (pBVar6 == (BrotliDecoderCompoundDictionary *)0x0) {
              return 0;
            }
            pBVar6->num_chunks = 0;
            pBVar6->total_size = 0;
            pBVar6->br_length = 0;
            pBVar6->br_copied = 0;
            pBVar6->block_bits = -1;
            pBVar6->chunk_offsets[0] = 0;
            state->compound_dictionary = pBVar6;
          }
          iVar4 = pBVar6->num_chunks;
          lVar7 = (long)iVar4;
          if (lVar7 == 0xf) {
            return 0;
          }
          pBVar6->chunks[lVar7] = puVar3;
          pBVar6->num_chunks = iVar4 + 1;
          iVar4 = (int)sVar2 + pBVar6->total_size;
          pBVar6->total_size = iVar4;
          pBVar6->chunk_offsets[lVar7 + 1] = iVar4;
          uVar9 = uVar9 + 1;
          pBVar5 = state->dictionary;
        } while (uVar9 < pBVar5->num_prefix);
      }
    }
  }
  return iVar8;
}

Assistant:

BROTLI_BOOL BrotliDecoderAttachDictionary(BrotliDecoderState *state, BrotliSharedDictionaryType type, size_t data_size,
                                          const uint8_t data[BROTLI_ARRAY_PARAM(data_size)]) {
	brotli_reg_t i;
	brotli_reg_t num_prefix_before = state->dictionary->num_prefix;
	if (state->state != BROTLI_STATE_UNINITED)
		return BROTLI_FALSE;
	if (!BrotliSharedDictionaryAttach(state->dictionary, type, data_size, data)) {
		return BROTLI_FALSE;
	}
	for (i = num_prefix_before; i < state->dictionary->num_prefix; i++) {
		if (!AttachCompoundDictionary(state, state->dictionary->prefix[i], state->dictionary->prefix_size[i])) {
			return BROTLI_FALSE;
		}
	}
	return BROTLI_TRUE;
}